

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

bin_t * arena_bin_choose_lock(tsdn_t *tsdn,arena_t *arena,szind_t binind,uint *binshard)

{
  bin_t *mutex;
  uint uVar1;
  
  uVar1 = 0;
  if ((tsdn != (tsdn_t *)0x0) &&
     (uVar1 = 0,
     (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena != (arena_t *)0x0)) {
    uVar1 = (uint)(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.
                  binshard[binind];
  }
  *binshard = uVar1;
  mutex = arena->bins[binind].bin_shards + uVar1;
  malloc_mutex_lock(tsdn,&mutex->lock);
  return mutex;
}

Assistant:

bin_t *
arena_bin_choose_lock(tsdn_t *tsdn, arena_t *arena, szind_t binind,
    unsigned *binshard) {
	bin_t *bin;
	if (tsdn_null(tsdn) || tsd_arena_get(tsdn_tsd(tsdn)) == NULL) {
		*binshard = 0;
	} else {
		*binshard = tsd_binshardsp_get(tsdn_tsd(tsdn))->binshard[binind];
	}
	assert(*binshard < bin_infos[binind].n_shards);
	bin = &arena->bins[binind].bin_shards[*binshard];
	malloc_mutex_lock(tsdn, &bin->lock);

	return bin;
}